

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a2a.cc
# Opt level: O1

void __thiscall bsplib::A2A::exchange(A2A *this)

{
  LinCost *this_00;
  pointer puVar1;
  long *plVar2;
  int iVar3;
  unsigned_long uVar4;
  iterator iVar5;
  pointer puVar6;
  pointer puVar7;
  pointer puVar8;
  pointer puVar9;
  pointer ppoVar10;
  bool bVar11;
  ulong *puVar12;
  size_t sVar13;
  ulong *puVar14;
  ulong *puVar15;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  size_t global_comm_send [3];
  size_t global_comm_recv [3];
  long local_70;
  unsigned_long local_68;
  ulong local_60;
  size_t local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  MPI_Alltoall((this->m_send_sizes).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,8,&ompi_mpi_byte,
               (this->m_recv_sizes).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start,8,&ompi_mpi_byte,this->m_comm);
  this_00 = &this->m_lincost;
  LinCost::reset(this_00,this->m_nprocs);
  if (0 < this->m_nprocs) {
    lVar21 = 0;
    do {
      uVar4 = (this->m_send_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar21];
      if (uVar4 != 0) {
        iVar5._M_current =
             (this->m_lincost).m_sizes.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_68 = uVar4;
        if (iVar5._M_current ==
            (this->m_lincost).m_sizes.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                     &(this->m_lincost).m_sizes,iVar5,&local_68);
        }
        else {
          *iVar5._M_current = uVar4;
          (this->m_lincost).m_sizes.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 < this->m_nprocs);
  }
  sVar13 = LinCost::get_bruck_vol(this_00);
  LinCost::reset(this_00,this->m_nprocs);
  if (0 < this->m_nprocs) {
    lVar21 = 0;
    do {
      uVar4 = (this->m_recv_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar21];
      if (uVar4 != 0) {
        iVar5._M_current =
             (this->m_lincost).m_sizes.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_68 = uVar4;
        if (iVar5._M_current ==
            (this->m_lincost).m_sizes.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long_const&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)
                     &(this->m_lincost).m_sizes,iVar5,&local_68);
        }
        else {
          *iVar5._M_current = uVar4;
          (this->m_lincost).m_sizes.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar5._M_current + 1;
        }
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 < this->m_nprocs);
  }
  local_58 = LinCost::get_bruck_vol(this_00);
  if (local_58 < sVar13) {
    local_58 = sVar13;
  }
  puVar15 = (this->m_send_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (1 < (ulong)(long)this->m_nprocs) {
    lVar21 = (long)this->m_nprocs * 8 + -8;
    puVar14 = puVar15;
    do {
      puVar14 = puVar14 + 1;
      puVar12 = puVar14;
      if (*puVar14 <= *puVar15) {
        puVar12 = puVar15;
      }
      puVar15 = puVar12;
      lVar21 = lVar21 + -8;
    } while (lVar21 != 0);
  }
  local_60 = *puVar15;
  local_68 = this->m_send_cap;
  MPI_Allreduce(&local_68,&local_48,3,&ompi_mpi_unsigned_long);
  if (((this->m_method == RMA) && (local_48 != this->m_recv_cap)) &&
     (this->m_recv_win != (MPI_Win)&ompi_mpi_win_null)) {
    MPI_Win_free(&this->m_recv_win);
  }
  std::vector<char,_std::allocator<char>_>::resize
            (&this->m_recv_bufs,(long)this->m_nprocs * local_48);
  if ((this->m_method == RMA) && (local_48 != this->m_recv_cap)) {
    MPI_Win_create((this->m_recv_bufs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,(long)this->m_nprocs * local_48,1,
                   &ompi_mpi_info_null);
  }
  this->m_recv_cap = local_48;
  if (local_48 < local_40) {
    __assert_fail("m_recv_cap >= max_recv",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/a2a.cc"
                  ,0xa8,"void bsplib::A2A::exchange()");
  }
  if (local_40 == 0) {
    iVar3 = this->m_nprocs;
    if (0 < (long)iVar3) {
      puVar6 = (this->m_recv_sizes).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar7 = (this->m_send_sizes).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar8 = (this->m_send_pos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      puVar9 = (this->m_recv_pos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar21 = 0;
      do {
        puVar6[lVar21] = 0;
        puVar7[lVar21] = 0;
        puVar9[lVar21] = 0;
        puVar8[lVar21] = 0;
        lVar21 = lVar21 + 1;
      } while (iVar3 != lVar21);
    }
  }
  else {
    uVar20 = local_38;
    if (this->m_small_a2a_size_per_proc < local_38) {
      uVar20 = this->m_small_a2a_size_per_proc;
    }
    if (0 < this->m_nprocs) {
      lVar21 = 0;
      lVar23 = 0;
      do {
        uVar17 = (this->m_send_sizes).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar23];
        if (uVar20 <= uVar17) {
          uVar17 = uVar20;
        }
        memcpy((this->m_small_send_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start + lVar21,
               (this->m_send_bufs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start + this->m_send_cap * lVar23,uVar17);
        lVar23 = lVar23 + 1;
        lVar21 = lVar21 + uVar20;
      } while (lVar23 < this->m_nprocs);
    }
    MPI_Alltoall((this->m_small_send_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,uVar20 & 0xffffffff,&ompi_mpi_byte,
                 (this->m_small_recv_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start,uVar20 & 0xffffffff,&ompi_mpi_byte,this->m_comm);
    uVar16 = this->m_nprocs;
    if (0 < (int)uVar16) {
      lVar21 = 0;
      lVar23 = 0;
      do {
        uVar17 = (this->m_recv_sizes).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar23];
        if (uVar20 <= uVar17) {
          uVar17 = uVar20;
        }
        memcpy((this->m_recv_bufs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start + this->m_recv_cap * lVar23,
               (this->m_small_recv_buf).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start + lVar21,uVar17);
        lVar23 = lVar23 + 1;
        uVar16 = this->m_nprocs;
        lVar21 = lVar21 + uVar20;
      } while (lVar23 < (int)uVar16);
    }
    if (this->m_method == RMA) {
      if (this->m_recv_cap == 0) {
        __assert_fail("m_recv_cap > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/a2a.cc"
                      ,0xce,"void bsplib::A2A::exchange()");
      }
      if (this->m_recv_win == (MPI_Win)&ompi_mpi_win_null) {
        __assert_fail("m_recv_win != MPI_WIN_NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/a2a.cc"
                      ,0xcf,"void bsplib::A2A::exchange()");
      }
      MPI_Win_fence(0);
      if (0 < this->m_nprocs) {
        local_70 = 0;
        local_50 = uVar20;
        do {
          uVar20 = (this->m_send_sizes).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[local_70];
          uVar17 = local_50;
          if (uVar20 < local_50) {
            uVar17 = uVar20;
          }
          uVar20 = uVar20 - uVar17;
          if (uVar20 != 0) {
            lVar21 = (long)this->m_pid * this->m_recv_cap + uVar17;
            lVar23 = this->m_send_cap * local_70 + uVar17;
            do {
              uVar17 = this->m_max_msg_size;
              if (uVar20 < this->m_max_msg_size) {
                uVar17 = uVar20;
              }
              MPI_Put((this->m_send_bufs).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start + lVar23,uVar17 & 0xffffffff,&ompi_mpi_byte,
                      local_70,lVar21,uVar17 & 0xffffffff,&ompi_mpi_byte,this->m_recv_win);
              lVar23 = lVar23 + uVar17;
              lVar21 = lVar21 + uVar17;
              uVar20 = uVar20 - uVar17;
            } while (uVar20 != 0);
          }
          local_70 = local_70 + 1;
        } while (local_70 < this->m_nprocs);
      }
      MPI_Win_fence(0,this->m_recv_win);
    }
    else if (this->m_method == MSG) {
      if (0 < (int)uVar16) {
        puVar6 = (this->m_send_sizes).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar7 = (this->m_send_pos).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar8 = (this->m_recv_sizes).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar9 = (this->m_recv_pos).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar17 = 0;
        do {
          uVar22 = puVar6[uVar17];
          uVar18 = uVar20;
          if (uVar22 < uVar20) {
            uVar18 = uVar22;
          }
          uVar19 = puVar8[uVar17];
          if (uVar20 <= uVar19) {
            uVar19 = uVar20;
          }
          puVar6[uVar17] = uVar22 - uVar18;
          puVar7[uVar17] = this->m_send_cap * uVar17 + uVar18;
          puVar1 = puVar8 + uVar17;
          *puVar1 = *puVar1 - uVar19;
          puVar9[uVar17] = this->m_recv_cap * uVar17 + uVar19;
          uVar17 = uVar17 + 1;
        } while (uVar16 != uVar17);
      }
      local_68 = CONCAT44(local_68._4_4_,0xffff8002);
      bVar11 = true;
      do {
        if (0 < this->m_nprocs) {
          lVar21 = 0;
          uVar20 = 0;
          do {
            ppoVar10 = (this->m_reqs).
                       super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            if (*(undefined **)((long)ppoVar10 + lVar21) == &ompi_request_null) {
              uVar17 = *(ulong *)((long)(this->m_recv_sizes).
                                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar21);
              uVar22 = this->m_max_msg_size;
              if (uVar17 < this->m_max_msg_size) {
                uVar22 = uVar17;
              }
              if (uVar22 != 0) {
                MPI_Irecv((this->m_recv_bufs).super__Vector_base<char,_std::allocator<char>_>.
                          _M_impl.super__Vector_impl_data._M_start +
                          *(long *)((long)(this->m_recv_pos).
                                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                          ._M_impl.super__Vector_impl_data._M_start + lVar21),
                          uVar22 & 0xffffffff,&ompi_mpi_byte,uVar20 & 0xffffffff,0,this->m_comm,
                          (long)ppoVar10 + lVar21);
              }
              plVar2 = (long *)((long)(this->m_recv_sizes).
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar21);
              *plVar2 = *plVar2 - uVar22;
              plVar2 = (long *)((long)(this->m_recv_pos).
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar21);
              *plVar2 = *plVar2 + uVar22;
            }
            uVar20 = uVar20 + 1;
            lVar21 = lVar21 + 8;
          } while ((long)uVar20 < (long)this->m_nprocs);
        }
        if (bVar11) {
          MPI_Barrier(this->m_comm);
        }
        uVar20 = (ulong)(uint)this->m_nprocs;
        if (0 < this->m_nprocs) {
          uVar17 = 0;
          do {
            lVar21 = (long)(int)uVar20 + uVar17;
            ppoVar10 = (this->m_reqs).
                       super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            if (ppoVar10[lVar21] == (ompi_request_t *)&ompi_request_null) {
              uVar20 = (this->m_send_sizes).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar17];
              uVar22 = this->m_max_msg_size;
              if (uVar20 < this->m_max_msg_size) {
                uVar22 = uVar20;
              }
              if (uVar22 != 0) {
                ppoVar10 = ppoVar10 + lVar21;
                if (bVar11) {
                  MPI_Irsend((this->m_send_bufs).super__Vector_base<char,_std::allocator<char>_>.
                             _M_impl.super__Vector_impl_data._M_start +
                             (this->m_send_pos).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar17],uVar22 & 0xffffffff,
                             &ompi_mpi_byte,uVar17 & 0xffffffff,0,this->m_comm,ppoVar10);
                }
                else {
                  MPI_Isend((this->m_send_bufs).super__Vector_base<char,_std::allocator<char>_>.
                            _M_impl.super__Vector_impl_data._M_start +
                            (this->m_send_pos).
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start[uVar17],uVar22 & 0xffffffff,
                            &ompi_mpi_byte,uVar17 & 0xffffffff,0,this->m_comm,ppoVar10);
                }
              }
              puVar6 = (this->m_send_sizes).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar17;
              *puVar6 = *puVar6 - uVar22;
              puVar6 = (this->m_send_pos).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar17;
              *puVar6 = *puVar6 + uVar22;
            }
            uVar17 = uVar17 + 1;
            uVar20 = (ulong)this->m_nprocs;
          } while ((long)uVar17 < (long)uVar20);
        }
        ppoVar10 = (this->m_reqs).
                   super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        bVar11 = false;
        MPI_Waitsome((ulong)((long)(this->m_reqs).
                                   super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppoVar10) >> 3
                     ,ppoVar10,&local_68,
                     (this->m_ready).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start);
      } while ((int)local_68 != -0x7ffe);
      lVar21 = (long)this->m_nprocs;
      if (0 < lVar21) {
        puVar6 = (this->m_send_sizes).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar7 = (this->m_recv_sizes).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        ppoVar10 = (this->m_reqs).
                   super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        puVar8 = (this->m_recv_pos).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar23 = 0;
        do {
          if (puVar7[lVar23] != 0) {
            __assert_fail("m_recv_sizes[p] == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/a2a.cc"
                          ,0x134,"void bsplib::A2A::exchange()");
          }
          if (puVar6[lVar23] != 0) {
            __assert_fail("m_send_sizes[p] == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/a2a.cc"
                          ,0x135,"void bsplib::A2A::exchange()");
          }
          if (ppoVar10[lVar23] != (ompi_request_t *)&ompi_request_null) {
            __assert_fail("m_reqs[p] == MPI_REQUEST_NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/a2a.cc"
                          ,0x136,"void bsplib::A2A::exchange()");
          }
          if (ppoVar10[lVar21 + lVar23] != (ompi_request_t *)&ompi_request_null) {
            __assert_fail("m_reqs[m_nprocs+p] == MPI_REQUEST_NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/wijnand-suijlen[P]bsponmpi/src/a2a.cc"
                          ,0x137,"void bsplib::A2A::exchange()");
          }
          puVar7[lVar23] = puVar8[lVar23] - this->m_recv_cap * lVar23;
          lVar23 = lVar23 + 1;
        } while (lVar21 != lVar23);
      }
    }
  }
  this->m_send_cap = this->m_recv_cap;
  std::vector<char,_std::allocator<char>_>::resize
            (&this->m_send_bufs,(long)this->m_nprocs * this->m_recv_cap);
  iVar3 = this->m_nprocs;
  if (0 < (long)iVar3) {
    puVar6 = (this->m_send_sizes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar7 = (this->m_send_pos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar8 = (this->m_recv_pos).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar21 = 0;
    do {
      puVar6[lVar21] = 0;
      puVar7[lVar21] = 0;
      puVar8[lVar21] = 0;
      lVar21 = lVar21 + 1;
    } while (iVar3 != lVar21);
  }
  return;
}

Assistant:

void A2A::exchange( )
{
    std::size_t max_recv = 0, max_bruck_vol = 0;
    std::size_t new_cap = m_send_cap;
    {   
#ifdef PROFILE
        TicToc t( TicToc::MPI_META_A2A, 4*sizeof(std::size_t)*m_nprocs );
#endif

        // exchange data sizes. 
        MPI_Alltoall( m_send_sizes.data(), sizeof(std::size_t), MPI_BYTE,
                m_recv_sizes.data(), sizeof(std::size_t), MPI_BYTE,
                m_comm );

        // determine ideal nr of bytes to send over MPI_Alltoall
        m_lincost.reset( m_nprocs );
        for ( int i = 0; i < m_nprocs; ++i ) 
            if ( m_send_sizes[i] > 0 )
                m_lincost.send( m_send_sizes[i]);

        std::size_t pref_bruck_vol = m_lincost.get_bruck_vol();

        m_lincost.reset( m_nprocs );
        for ( int i = 0; i < m_nprocs; ++i ) 
            if ( m_recv_sizes[i] > 0 )
                m_lincost.send( m_recv_sizes[i]);

        // Determine max communication sizes
        pref_bruck_vol = 
            std::max( pref_bruck_vol, m_lincost.get_bruck_vol() );

        std::size_t max_send = *std::max_element( m_send_sizes.begin(),
                               m_send_sizes.begin() + m_nprocs );

        std::size_t global_comm_send[3] = 
            { m_send_cap, max_send, pref_bruck_vol };
        std::size_t global_comm_recv[3];

        MPI_Allreduce( global_comm_send, global_comm_recv,
                3, MY_MPI_SIZE_T, MPI_MAX, m_comm );

        new_cap       = global_comm_recv[0];
        max_recv      = global_comm_recv[1];
        max_bruck_vol = global_comm_recv[2];
    }

    // Ensure correct size memory of recv buffers
    if ( m_method == RMA && 
            new_cap != m_recv_cap && m_recv_win != MPI_WIN_NULL )
        MPI_Win_free( &m_recv_win );

    m_recv_bufs.resize( new_cap * m_nprocs );

    if ( m_method == RMA && new_cap != m_recv_cap ) {
        MPI_Win_create( m_recv_bufs.data(), 
                new_cap * m_nprocs, 1, 
                MPI_INFO_NULL, m_comm, &m_recv_win );
    }
    m_recv_cap = new_cap;

    assert( m_recv_cap >= max_recv );

    if ( max_recv == 0 ) {
        /* no need to do anything */
        clear();
    }
    else  {
        std::size_t sm = std::min( max_bruck_vol, m_small_a2a_size_per_proc ) ;
        {
#ifdef PROFILE
        TicToc t( TicToc::MPI_SMALL_A2A );
#endif
        for (int p = 0; p < m_nprocs; ++p ) {
            std::size_t size = std::min( sm, m_send_sizes[p]);
            memcpy( m_small_send_buf.data() + p * sm,
                    m_send_bufs.data() + p * m_send_cap,
                    size);
#ifdef PROFILE
            t.add_bytes( sm );
#endif
        }
        // In small exchanges, Bruck's algorithm will be used again
        MPI_Alltoall( m_small_send_buf.data(), int(sm), MPI_BYTE,
                m_small_recv_buf.data(), int(sm), MPI_BYTE,
                m_comm );

        for (int p = 0; p < m_nprocs; ++p ) {
            std::size_t size = std::min( sm, m_recv_sizes[p]);
            memcpy( m_recv_bufs.data() + p * m_recv_cap,
                    m_small_recv_buf.data() + p * sm,
                    size );
        }
        } // end plain all-to-all
        // start normal message exchange
        if ( m_method == RMA) { 
#ifdef PROFILE
        TicToc t( TicToc::MPI_PUT );
#endif
        assert( m_recv_cap > 0 );
        assert( m_recv_win != MPI_WIN_NULL );

        MPI_Win_fence( 0, m_recv_win );

        for (int p = 0; p < m_nprocs; ++p ) {
            std::size_t o = std::min( sm, m_send_sizes[p] );
            std::size_t size = m_send_sizes[p] - o;
            std::size_t o1 = m_send_cap * p + o;
            std::size_t o2 = m_recv_cap * m_pid + o;
#ifdef PROFILE
            t.add_bytes( size );
#endif
            while ( size > 0 ) {
                std::size_t s = std::min( m_max_msg_size, size );
                //size_t s = size;
                MPI_Put( m_send_bufs.data() + o1, int(s), MPI_BYTE,
                        p, o2, int(s), MPI_BYTE, m_recv_win );
                size -= s;
                o1 += s;
                o2 += s;
            }
        }

        MPI_Win_fence( 0, m_recv_win );
        } else if ( m_method == MSG ) {

#ifdef PROFILE
        TicToc tr( TicToc::MPI_LARGE_RECV );
        TicToc ts( TicToc::MPI_LARGE_SEND );
#endif

        for ( int p = 0 ; p < m_nprocs; ++p ) {
            std::size_t so = std::min( sm, m_send_sizes[p] );
            std::size_t ro = std::min( sm, m_recv_sizes[p] );

            m_send_sizes[p] -= so;
            m_send_pos[p] = p * m_send_cap + so;

            m_recv_sizes[p] -= ro;
            m_recv_pos[p] = p * m_recv_cap + ro;
        }

        // Do a personalized exchange
        int outcount = MPI_UNDEFINED;
        bool first_time = true;
        do {
            for (int p = 0; p < m_nprocs; ++p ) {
                if (m_reqs[p] != MPI_REQUEST_NULL) continue;

                std::size_t recv_size 
                    = std::min( m_max_msg_size, m_recv_sizes[p] );
#ifdef PROFILE
                tr.add_bytes( recv_size );
#endif

                int tag = 0;
                if (recv_size > 0 )
                    MPI_Irecv( m_recv_bufs.data() + m_recv_pos[p],
                            int( recv_size ), MPI_BYTE, p,
                            tag, m_comm, & m_reqs[p] );
                
                m_recv_sizes[p] -= recv_size;
                m_recv_pos[p] += recv_size;
            }

            if (first_time)
                MPI_Barrier( m_comm ); // Using the barrier the first time
                                       // allows to use ready sends

            for (int p = 0; p < m_nprocs; ++p ) {
                if (m_reqs[m_nprocs + p] != MPI_REQUEST_NULL) continue;

                std::size_t send_size 
                    = std::min( m_max_msg_size, m_send_sizes[p] );
#ifdef PROFILE
                ts.add_bytes( send_size );
#endif

                int tag = 0;
                if (send_size > 0 ) {
                    if (first_time)
                     MPI_Irsend( m_send_bufs.data() + m_send_pos[p],
                            int( send_size ), MPI_BYTE, p,
                            tag, m_comm, & m_reqs[m_nprocs + p ] );
                    else
                     MPI_Isend( m_send_bufs.data() + m_send_pos[p],
                            int( send_size ), MPI_BYTE, p,
                            tag, m_comm, & m_reqs[m_nprocs + p ] );
                }
                
                m_send_sizes[p] -= send_size;
                m_send_pos[p] += send_size;
            }
            
            first_time = false;

            MPI_Waitsome( int( m_reqs.size() ), m_reqs.data(), &outcount, 
                    m_ready.data(), MPI_STATUSES_IGNORE );
        } while (outcount != MPI_UNDEFINED );

        for (int p = 0 ; p < m_nprocs; ++p ) {
            assert( m_recv_sizes[p] == 0 );
            assert( m_send_sizes[p] == 0 );
            assert( m_reqs[p] == MPI_REQUEST_NULL );
            assert( m_reqs[m_nprocs+p] == MPI_REQUEST_NULL );
            m_recv_sizes[p] = m_recv_pos[p] - p * m_recv_cap;
        }
    } // end of plain message exchange
    } // end of else

    m_send_cap = m_recv_cap;
    m_send_bufs.resize( m_nprocs * m_send_cap );
    for (int p = 0 ; p < m_nprocs; ++p ) {
        m_send_sizes[p] = 0;
        m_send_pos[p] = 0;
        m_recv_pos[p] = 0;
    }
}